

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::XMLAttribute::~XMLAttribute(XMLAttribute *this)

{
  ~XMLAttribute(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~XMLAttribute()	{}